

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int cm_zlib_gzsetparams(gzFile file,int level,int strategy)

{
  size_t sVar1;
  gz_stream *s;
  int strategy_local;
  int level_local;
  gzFile file_local;
  
  if ((file == (gzFile)0x0) || (*(char *)((long)file + 0xac) != 'w')) {
    file_local._4_4_ = -2;
  }
  else {
    if (*(int *)((long)file + 0x20) == 0) {
      *(undefined8 *)((long)file + 0x18) = *(undefined8 *)((long)file + 0x88);
      sVar1 = fwrite(*(void **)((long)file + 0x88),1,0x4000,*(FILE **)((long)file + 0x78));
      if (sVar1 != 0x4000) {
        *(undefined4 *)((long)file + 0x70) = 0xffffffff;
      }
      *(undefined4 *)((long)file + 0x20) = 0x4000;
    }
    file_local._4_4_ = cm_zlib_deflateParams((z_streamp)file,level,strategy);
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzsetparams (file, level, strategy)
    gzFile file;
    int level;
    int strategy;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'w') return Z_STREAM_ERROR;

    /* Make room to allow flushing */
    if (s->stream.avail_out == 0) {

        s->stream.next_out = s->outbuf;
        if (fwrite(s->outbuf, 1, Z_BUFSIZE, s->file) != Z_BUFSIZE) {
            s->z_err = Z_ERRNO;
        }
        s->stream.avail_out = Z_BUFSIZE;
    }

    return deflateParams (&(s->stream), level, strategy);
}